

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O3

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetInlineeForTargetInlinee
          (FunctionCodeGenRuntimeData *this,ProfileId profiledCallSiteId,
          FunctionBody *inlineeFuncBody)

{
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionCodeGenRuntimeData *pFVar5;
  
  if (((this->functionBody).ptr)->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x33,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pWVar1 = (this->inlinees).ptr;
  if (pWVar1 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    for (pFVar5 = pWVar1[profiledCallSiteId].ptr; pFVar5 != (FunctionCodeGenRuntimeData *)0x0;
        pFVar5 = (pFVar5->next).ptr) {
      if ((pFVar5->functionBody).ptr == inlineeFuncBody) {
        return pFVar5;
      }
    }
  }
  return (FunctionCodeGenRuntimeData *)0x0;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionCodeGenRuntimeData::GetInlineeForTargetInlinee(const ProfileId profiledCallSiteId, FunctionBody *inlineeFuncBody) const
    {
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());

        if (!inlinees)
        {
            return nullptr;
        }
        FunctionCodeGenRuntimeData *runtimeData = inlinees[profiledCallSiteId];
        while (runtimeData && runtimeData->GetFunctionBody() != inlineeFuncBody)
        {
            runtimeData = runtimeData->next;
        }
        return runtimeData;
    }